

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool.cpp
# Opt level: O0

uint32_t __thiscall
Function_Pool::FunctionTask::Sum
          (FunctionTask *this,Image *image,uint32_t x,uint32_t y,uint32_t width,uint32_t height)

{
  uint32_t uVar1;
  FunctionTask *this_00;
  long in_RDI;
  OutputInfo *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffc8;
  TaskName in_stack_ffffffffffffffcc;
  
  FunctionPoolTask::_setup(&this->super_FunctionPoolTask,image,x,y,width,height);
  this_00 = (FunctionTask *)(in_RDI + 0xe0);
  std::
  unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>::
  operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
              *)0x146305);
  AreaInfo::_size((AreaInfo *)0x14630d);
  OutputInfo::resize((OutputInfo *)this_00,
                     CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  _process(this_00,in_stack_ffffffffffffffcc);
  uVar1 = OutputInfo::getSum(unaff_retaddr);
  return uVar1;
}

Assistant:

uint32_t Sum( const Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height )
        {
            _setup( image, x, y, width, height );
            _dataOut.resize( _infoIn1->_size() );
            _process( _Sum );
            return _dataOut.getSum();
        }